

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TDeletingArray<FDrawInfo_*,_FDrawInfo_*>::~TDeletingArray
          (TDeletingArray<FDrawInfo_*,_FDrawInfo_*> *this)

{
  FDrawInfo *this_00;
  ulong uVar1;
  
  if ((this->super_TArray<FDrawInfo_*,_FDrawInfo_*>).Count != 0) {
    uVar1 = 0;
    do {
      this_00 = (this->super_TArray<FDrawInfo_*,_FDrawInfo_*>).Array[uVar1];
      if (this_00 != (FDrawInfo *)0x0) {
        FDrawInfo::~FDrawInfo(this_00);
        operator_delete(this_00,0x3a8);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->super_TArray<FDrawInfo_*,_FDrawInfo_*>).Count);
  }
  TArray<FDrawInfo_*,_FDrawInfo_*>::~TArray(&this->super_TArray<FDrawInfo_*,_FDrawInfo_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}